

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O1

int __thiscall QToolBarAreaLayout::remove(QToolBarAreaLayout *this,char *__filename)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  pointer pQVar3;
  
  iVar1 = **(int **)(__filename + 8);
  iVar2 = (*(int **)(__filename + 8))[1];
  pQVar3 = QList<QToolBarAreaLayoutLine>::data(&this->docks[iVar1].lines);
  QList<QToolBarAreaLayoutItem>::removeAt
            (&pQVar3[iVar2].toolBarItems,(long)*(int *)(*(long *)(__filename + 8) + 8));
  if (pQVar3[iVar2].toolBarItems.d.size != 0) {
    return extraout_EAX;
  }
  QList<QToolBarAreaLayoutLine>::removeAt
            (&this->docks[iVar1].lines,(long)*(int *)(*(long *)(__filename + 8) + 4));
  return extraout_EAX_00;
}

Assistant:

void QToolBarAreaLayout::remove(const QList<int> &path)
{
    Q_ASSERT(path.size() == 3);
    QToolBarAreaLayoutInfo &dock = docks[path.at(0)];
    QToolBarAreaLayoutLine &line = dock.lines[path.at(1)];
    line.toolBarItems.removeAt(path.at(2));
    if (line.toolBarItems.isEmpty())
        dock.lines.removeAt(path.at(1));
}